

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,uint8_t *compiledRules,uint32_t ruleLength,
          UErrorCode *status)

{
  RBBIDataHeader *data_00;
  UBool UVar1;
  RBBIDataWrapper *this_00;
  EVP_PKEY_CTX *size;
  RBBIDataWrapper *local_b0;
  RBBIDataHeader *data;
  UnicodeString local_68;
  EVP_PKEY_CTX *local_28;
  UErrorCode *status_local;
  RBBIDataHeader *pRStack_18;
  uint32_t ruleLength_local;
  uint8_t *compiledRules_local;
  RuleBasedBreakIterator *this_local;
  
  local_28 = (EVP_PKEY_CTX *)status;
  status_local._4_4_ = ruleLength;
  pRStack_18 = (RBBIDataHeader *)compiledRules;
  compiledRules_local = (uint8_t *)this;
  BreakIterator::BreakIterator(&this->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_005c17a0;
  icu_63::UnicodeString::UnicodeString(&local_68);
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_68);
  icu_63::UnicodeString::~UnicodeString(&local_68);
  size = local_28;
  init(this,local_28);
  UVar1 = ::U_FAILURE(*(UErrorCode *)local_28);
  data_00 = pRStack_18;
  if (UVar1 == '\0') {
    if ((pRStack_18 == (RBBIDataHeader *)0x0) || (status_local._4_4_ < 0x50)) {
      *(UErrorCode *)local_28 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (status_local._4_4_ < pRStack_18->fLength) {
      *(UErrorCode *)local_28 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this_00 = (RBBIDataWrapper *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
      local_b0 = (RBBIDataWrapper *)0x0;
      if (this_00 != (RBBIDataWrapper *)0x0) {
        RBBIDataWrapper::RBBIDataWrapper(this_00,data_00,kDontAdopt,(UErrorCode *)local_28);
        local_b0 = this_00;
      }
      this->fData = local_b0;
      UVar1 = ::U_FAILURE(*(UErrorCode *)local_28);
      if ((UVar1 == '\0') && (this->fData == (RBBIDataWrapper *)0x0)) {
        *(UErrorCode *)local_28 = U_MEMORY_ALLOCATION_ERROR;
      }
    }
  }
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator(const uint8_t *compiledRules,
                       uint32_t       ruleLength,
                       UErrorCode     &status)
 : fSCharIter(UnicodeString())
{
    init(status);
    if (U_FAILURE(status)) {
        return;
    }
    if (compiledRules == NULL || ruleLength < sizeof(RBBIDataHeader)) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    const RBBIDataHeader *data = (const RBBIDataHeader *)compiledRules;
    if (data->fLength > ruleLength) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    fData = new RBBIDataWrapper(data, RBBIDataWrapper::kDontAdopt, status);
    if (U_FAILURE(status)) {return;}
    if(fData == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
}